

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<int>::SolveSOR
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *param_5,REAL overrelax,REAL *tol,
          int FromCurrent,int direction)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_var;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long row;
  long lVar9;
  int64_t j;
  long row_00;
  int64_t ic;
  long col;
  bool bVar10;
  double dVar11;
  long lVar4;
  
  if (residual == F) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
    return;
  }
  if (residual == (TPZFMatrix<int> *)0x0) {
    iVar1 = (int)*tol * 2 + 1;
  }
  else {
    iVar1 = Norm(residual);
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
  }
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar4 = CONCAT44(extraout_var,iVar2);
  lVar8 = 0;
  bVar10 = direction != -1;
  lVar6 = lVar4 + -1;
  if (bVar10) {
    lVar6 = lVar8;
  }
  lVar7 = (F->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
  lVar9 = -1;
  if (bVar10) {
    lVar9 = lVar4;
  }
  if (lVar4 == 0 || extraout_var < 0) {
    lVar4 = lVar8;
  }
  if (lVar7 < 1) {
    lVar7 = lVar8;
  }
  while ((lVar8 < *numiterations && (ABS(*tol) < ABS((double)iVar1)))) {
    iVar1 = 0;
    for (col = 0; row = lVar6, col != lVar7; col = col + 1) {
      for (; row != lVar9; row = row + (ulong)bVar10 * 2 + -1) {
        iVar2 = (*(F->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                  [0x24])(F,row,col);
        for (row_00 = 0; lVar4 != row_00; row_00 = row_00 + 1) {
          iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,row,row_00);
          piVar5 = TPZFMatrix<int>::operator()(result,row_00,col);
          iVar2 = iVar2 - iVar3 * *piVar5;
        }
        iVar1 = iVar1 + iVar2 * iVar2;
        iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,row,row)
        ;
        piVar5 = TPZFMatrix<int>::operator()(result,row,col);
        *piVar5 = *piVar5 + (iVar2 * (int)overrelax) / iVar3;
      }
    }
    dVar11 = (double)iVar1;
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar8 = lVar8 + 1;
    iVar1 = (int)dVar11;
  }
  if (residual != (TPZFMatrix<int> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar8;
  *tol = ABS((double)iVar1);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}